

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5MultiIterNext(Fts5Index *p,Fts5Iter *pIter,int bFrom,i64 iFrom)

{
  Fts5DlidxIter *pIter_00;
  ushort *puVar1;
  byte bVar2;
  int iVar3;
  ushort uVar4;
  int iVar5;
  Fts5SegIter *pFVar6;
  bool bVar7;
  int bNewTerm;
  int local_48;
  uint local_44;
  ulong local_40;
  Fts5SegIter *local_38;
  
  if (p->rc == 0) {
    bVar7 = bFrom == 0;
    do {
      local_40 = (ulong)pIter->aFirst[1].iFirst;
      local_48 = 0;
      pFVar6 = pIter->aSeg + local_40;
      local_38 = pFVar6;
      if ((bVar7) || (pIter_00 = pFVar6->pDlidx, pIter_00 == (Fts5DlidxIter *)0x0)) {
        (*pFVar6->xNext)(p,pFVar6,&local_48);
        bVar7 = pFVar6->pLeaf == (Fts5Data *)0x0;
LAB_001a515a:
        if (((bVar7) || (local_48 != 0)) ||
           (iVar3 = fts5MultiIterAdvanceRowid(pIter,(int)local_40,&local_38), pFVar6 = local_38,
           iVar3 != 0)) goto LAB_001a517b;
      }
      else {
        local_44 = pFVar6->flags;
        if ((local_44 & 2) == 0) {
          if (pIter_00->aLvl[0].bEof != 0) goto LAB_001a51d6;
          if (pIter_00->aLvl[0].iRowid < iFrom) {
            do {
              iVar5 = pIter_00->aLvl[0].iLeafPgno;
              fts5DlidxIterNextR(p,pIter_00,0);
              iVar3 = p->rc;
              if ((p->rc != 0) || (iVar3 = 0, pIter_00->aLvl[0].bEof != 0)) break;
              iVar3 = 0;
            } while (pIter_00->aLvl[0].iRowid < iFrom);
          }
          else {
            iVar5 = pFVar6->iLeafPgno;
            iVar3 = 0;
          }
          if (pFVar6->iLeafPgno < iVar5) {
            if (pFVar6->pSeg->pgnoLast < iVar5) {
              p->rc = 0x10b;
            }
            else {
              sqlite3_free(pFVar6->pNextLeaf);
              pFVar6->pNextLeaf = (Fts5Data *)0x0;
              pFVar6->iLeafPgno = iVar5 + -1;
              fts5SegIterNextPage(p,pFVar6);
              if (p->rc == 0) {
                puVar1 = (ushort *)pFVar6->pLeaf->p;
                uVar4 = *puVar1;
                uVar4 = uVar4 << 8 | uVar4 >> 8;
                if ((uVar4 < 4) || (pFVar6->pLeaf->szLeaf <= (int)(uint)uVar4)) {
                  p->rc = 0x10b;
                }
                else {
                  bVar2 = sqlite3Fts5GetVarint
                                    ((uchar *)((long)puVar1 + (ulong)uVar4),(u64 *)&pFVar6->iRowid);
                  pFVar6->iLeafOffset = (uint)bVar2 + (uint)uVar4;
                  fts5SegIterLoadNPos(p,pFVar6);
                }
              }
            }
          }
          else {
LAB_001a5099:
            if (iVar3 == 0) goto LAB_001a51d6;
          }
        }
        else {
          do {
            iVar3 = 0;
            if ((pIter_00->aLvl[0].bEof != 0) || (iVar3 = 0, pIter_00->aLvl[0].iRowid <= iFrom))
            break;
            fts5DlidxIterPrevR(p,pIter_00,0);
            iVar3 = p->rc;
          } while (iVar3 == 0);
          iVar5 = pIter_00->aLvl[0].iLeafPgno;
          if (pFVar6->iLeafPgno <= iVar5) goto LAB_001a5099;
          pFVar6->iLeafPgno = iVar5 + 1;
          fts5SegIterReverseNewPage(p,pFVar6);
        }
        while (pFVar6->pLeaf != (Fts5Data *)0x0) {
          if ((local_44 & 2) != 0) {
            if (iFrom < pFVar6->iRowid) goto LAB_001a5151;
LAB_001a5158:
            bVar7 = false;
            goto LAB_001a515a;
          }
          if (iFrom <= pFVar6->iRowid) goto LAB_001a5158;
LAB_001a5151:
          if (p->rc != 0) goto LAB_001a5158;
LAB_001a51d6:
          (*pFVar6->xNext)(p,pFVar6,(int *)0x0);
        }
LAB_001a517b:
        fts5MultiIterAdvanced(p,pIter,(int)local_40,1);
        uVar4 = pIter->aFirst[1].iFirst;
        bVar7 = pIter->aSeg[uVar4].pLeaf == (Fts5Data *)0x0;
        (pIter->base).bEof = bVar7;
        pIter->iSwitchRowid = pIter->aSeg[uVar4].iRowid;
        if (bVar7) {
          return;
        }
        pFVar6 = pIter->aSeg + uVar4;
      }
      if ((pIter->bSkipEmpty == '\0') || (pFVar6->nPos != 0)) {
        (*pIter->xSetOutputs)(pIter,pFVar6);
        return;
      }
      bVar7 = true;
    } while (p->rc == 0);
  }
  return;
}

Assistant:

static void fts5MultiIterNext(
  Fts5Index *p, 
  Fts5Iter *pIter,
  int bFrom,                      /* True if argument iFrom is valid */
  i64 iFrom                       /* Advance at least as far as this */
){
  int bUseFrom = bFrom;
  assert( pIter->base.bEof==0 );
  while( p->rc==SQLITE_OK ){
    int iFirst = pIter->aFirst[1].iFirst;
    int bNewTerm = 0;
    Fts5SegIter *pSeg = &pIter->aSeg[iFirst];
    assert( p->rc==SQLITE_OK );
    if( bUseFrom && pSeg->pDlidx ){
      fts5SegIterNextFrom(p, pSeg, iFrom);
    }else{
      pSeg->xNext(p, pSeg, &bNewTerm);
    }

    if( pSeg->pLeaf==0 || bNewTerm 
     || fts5MultiIterAdvanceRowid(pIter, iFirst, &pSeg)
    ){
      fts5MultiIterAdvanced(p, pIter, iFirst, 1);
      fts5MultiIterSetEof(pIter);
      pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      if( pSeg->pLeaf==0 ) return;
    }

    fts5AssertMultiIterSetup(p, pIter);
    assert( pSeg==&pIter->aSeg[pIter->aFirst[1].iFirst] && pSeg->pLeaf );
    if( pIter->bSkipEmpty==0 || pSeg->nPos ){
      pIter->xSetOutputs(pIter, pSeg);
      return;
    }
    bUseFrom = 0;
  }
}